

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O0

void * ecs_os_api_realloc(void *ptr,ecs_size_t size)

{
  void *pvVar1;
  ecs_size_t size_local;
  void *ptr_local;
  
  _ecs_assert(0 < size,2,(char *)0x0,"size > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/os_api.c"
              ,0x8a);
  if (0 < size) {
    if (ptr == (void *)0x0) {
      ecs_os_api_malloc_count = ecs_os_api_malloc_count + 1;
    }
    else {
      ecs_os_api_realloc_count = ecs_os_api_realloc_count + 1;
    }
    pvVar1 = realloc(ptr,(long)size);
    return pvVar1;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/os_api.c"
                ,0x8a,"void *ecs_os_api_realloc(void *, ecs_size_t)");
}

Assistant:

static
void* ecs_os_api_realloc(void *ptr, ecs_size_t size) {
    ecs_assert(size > 0, ECS_INVALID_PARAMETER, NULL);

    if (ptr) {
        ecs_os_api_realloc_count ++;
    } else {
        /* If not actually reallocing, treat as malloc */
        ecs_os_api_malloc_count ++; 
    }
    
    return realloc(ptr, (size_t)size);
}